

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

void duckdb::ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  bool bVar2;
  BoundFunctionExpression *pBVar3;
  reference pvVar4;
  Vector *vector;
  Vector *vector_00;
  UnifiedVectorFormat *pUVar5;
  InvalidInputException *pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  UnifiedVectorFormat *pUVar7;
  float *res_data;
  UnifiedVectorFormat *pUVar8;
  allocator local_199;
  BoundFunctionExpression *local_198;
  Vector *local_190;
  long local_188;
  long local_180;
  long local_178;
  TemplatedValidityMask<unsigned_long> *local_170;
  TemplatedValidityMask<unsigned_long> *local_168;
  string local_160;
  string local_140;
  string local_120 [32];
  string local_100;
  string local_e0 [32];
  UnifiedVectorFormat rhs_format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  UnifiedVectorFormat lhs_format;
  long local_68;
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar4);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar4);
  local_190 = result;
  local_188 = duckdb::ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lhs_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&rhs_format);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,pUVar1);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,pUVar1);
  local_198 = pBVar3 + 0x60;
  local_168 = (TemplatedValidityMask<unsigned_long> *)(vector + 0x28);
  local_170 = (TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28);
  local_178 = *(long *)(vector + 0x20);
  local_180 = *(long *)(vector_00 + 0x20);
  res_data = *(float **)(local_188 + 0x20);
  pUVar8 = (UnifiedVectorFormat *)0x0;
  do {
    if (pUVar1 == pUVar8) {
      if (pUVar1 == (UnifiedVectorFormat *)0x1) {
        duckdb::Vector::SetVectorType((VectorType)local_190);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&rhs_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lhs_format);
      return;
    }
    pUVar5 = pUVar8;
    if (*_lhs_format != 0) {
      pUVar5 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lhs_format + (long)pUVar8 * 4);
    }
    pUVar7 = pUVar8;
    if (*_rhs_format != 0) {
      pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_rhs_format + (long)pUVar8 * 4);
    }
    if (((local_68 == 0) ||
        ((*(ulong *)(local_68 + ((ulong)pUVar5 >> 6) * 8) >> ((ulong)pUVar5 & 0x3f) & 1) != 0)) &&
       ((params = local_b0,
        local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
        (params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (&local_b0->_M_dataplus)[(ulong)pUVar7 >> 6]._M_p,
        ((ulong)params >> ((ulong)pUVar7 & 0x3f) & 1) != 0)))) {
      bVar2 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        (local_168,(long)pUVar5 * 3 + 3,(long)pUVar5 * 3);
      if (!bVar2) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_e0,"%s: left argument can not contain NULL values",&local_199);
        std::__cxx11::string::string((string *)&local_100,(string *)local_198);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_e0,&local_100,params);
        duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_160);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        (local_170,(long)pUVar7 * 3 + 3,(long)pUVar7 * 3);
      if (!bVar2) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_120,"%s: right argument can not contain NULL values",&local_199);
        std::__cxx11::string::string((string *)&local_140,(string *)local_198);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_120,&local_140,params);
        duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_160);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      CrossProductOp::Operation<float>
                ((float *)(local_178 + (long)pUVar5 * 0xc),(float *)(local_180 + (long)pUVar7 * 0xc)
                 ,res_data,3);
    }
    else {
      duckdb::FlatVector::SetNull(local_190,(ulong)pUVar8,true);
    }
    pUVar8 = pUVar8 + 1;
    res_data = res_data + 3;
  } while( true );
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}